

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
dlib::
add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>
::add_layer(add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>
            *this)

{
  bool bVar1;
  long in_RDI;
  resizable_tensor *this_00;
  pointer in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>
  *in_stack_ffffffffffffffb0;
  
  avg_pool_<2L,_2L,_2,_2,_0,_0>::avg_pool_
            ((avg_pool_<2L,_2L,_2,_2,_0,_0> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  operator_new(0x760);
  add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>
  ::add_skip_layer(in_stack_ffffffffffffffb0);
  std::
  unique_ptr<dlib::add_skip_layer<dlib::tag1,dlib::add_tag_layer<2ul,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<1024l,1l,1l,1,1,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<256l,3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<256l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::repeat<3ul,resnet::def<dlib::bn_con>::resbottleneck_128,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::add_prev_<dlib::tag2>,dlib::add_layer<dlib::avg_pool_<2l,2l,2,2,0,0>,dlib::add_skip_layer<dlib::tag1,dlib::add_tag_layer<2ul,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<512l,1l,1l,1,1,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<128l,3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<128l,1l,1l,1,1,...void>,void>,void>>,void>,void>,void>>,void>,void>,void>,void>,void>,void>,void>,void>,void>,void>>>>
  ::
  unique_ptr<std::default_delete<dlib::add_skip_layer<dlib::tag1,dlib::add_tag_layer<2ul,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<1024l,1l,1l,1,1,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<256l,3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<256l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::repeat<3ul,resnet::def<dlib::bn_con>::resbottleneck_128,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::add_prev_<dlib::tag2>,dlib::add_layer<dlib::avg_pool_<2l,2l,2,2,0,0>,dlib::add_skip_layer<dlib::tag1,dlib::add_tag_layer<2ul,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<512l,1l,1l,1,1,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<128l,3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<128l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::repeat<3ul,resnet::def<dlib::bn_con>::resbottleneck_64,dlib::add_layer<dlib::max_pool_<3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>,void>,void>,void>>,void>,void>,void>,void>,void>,void>,void>,void>,void>,void>>,void>,void>,void>>,void>,void>,void>,void>,void>,void>,void>,void>,void>,void>>>,void>
            ((unique_ptr<_a8e22392_> *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)
             ,in_stack_ffffffffffffff98);
  *(undefined1 *)(in_RDI + 200) = 0;
  *(undefined1 *)(in_RDI + 0xc9) = 1;
  *(undefined1 *)(in_RDI + 0xca) = 0;
  resizable_tensor::resizable_tensor((resizable_tensor *)in_stack_ffffffffffffffb0);
  resizable_tensor::resizable_tensor((resizable_tensor *)in_stack_ffffffffffffffb0);
  this_00 = (resizable_tensor *)(in_RDI + 0x200);
  resizable_tensor::resizable_tensor(this_00);
  resizable_tensor::resizable_tensor(this_00);
  bVar1 = this_layer_operates_inplace
                    ((add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>
                      *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  if (bVar1) {
    std::unique_ptr<$a8e22392$>::operator->((unique_ptr<_a8e22392_> *)0x1be2ff);
    add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>
    ::disable_output_and_gradient_getters
              ((add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>
                *)0x1be307);
  }
  return;
}

Assistant:

add_layer(
        ):
            subnetwork(new subnet_type()),
            this_layer_setup_called(false),
            gradient_input_is_stale(true),
            get_output_and_gradient_input_disabled(false)
        {
            if (this_layer_operates_inplace())
                subnetwork->disable_output_and_gradient_getters();
        }